

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.c
# Opt level: O2

_Bool al_join_paths(ALLEGRO_PATH *path,ALLEGRO_PATH *tail)

{
  _Bool _Var1;
  char *s;
  ulong uVar2;
  
  _Var1 = path_is_absolute(tail);
  if (!_Var1) {
    al_ustr_assign(path->filename,tail->filename);
    for (uVar2 = 0; uVar2 < (tail->segments)._size; uVar2 = (ulong)((uint)uVar2 + 1)) {
      s = get_segment_cstr(tail,(uint)uVar2);
      al_append_path_component(path,s);
    }
  }
  return !_Var1;
}

Assistant:

bool al_join_paths(ALLEGRO_PATH *path, const ALLEGRO_PATH *tail)
{
   unsigned i;
   ASSERT(path);
   ASSERT(tail);

   /* Don't bother concating if the tail is an absolute path. */
   if (path_is_absolute(tail)) {
      return false;
   }

   /* We ignore tail->drive.  The other option is to do nothing if tail
    * contains a drive letter.
    */

   al_ustr_assign(path->filename, tail->filename);

   for (i = 0; i < _al_vector_size(&tail->segments); i++) {
      al_append_path_component(path, get_segment_cstr(tail, i));
   }

   return true;
}